

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

bool __thiscall
math::wide_integer::uintwide_t<512u,unsigned_int,void,false>::wr_string<char*>
          (uintwide_t<512u,unsigned_int,void,false> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  int *piVar1;
  byte bVar2;
  uint uVar3;
  unsigned_fast_type i;
  long lVar4;
  unsigned_fast_type uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  undefined7 in_register_00000011;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  uintwide_t<24U,_unsigned_char,_void,_false> t_1;
  uintwide_t<24U,_unsigned_char,_void,_false> tmp;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  byte local_16b [134];
  undefined1 local_e5;
  char local_e4 [27];
  undefined1 local_c9;
  undefined1 local_c8;
  undefined1 local_ba;
  undefined1 local_b9;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar8 = (int)CONCAT71(in_register_00000011,base_rep);
  if (iVar8 == 0x10) {
    local_1f8 = *(undefined8 *)this;
    uStack_1f0 = *(undefined8 *)(this + 8);
    local_1e8 = *(undefined8 *)(this + 0x10);
    uStack_1e0 = *(undefined8 *)(this + 0x18);
    local_1d8 = *(undefined8 *)(this + 0x20);
    uStack_1d0 = *(undefined8 *)(this + 0x28);
    local_1c8 = *(undefined8 *)(this + 0x30);
    uStack_1c0 = *(undefined8 *)(this + 0x38);
    memset(local_16b,0,0x88);
    lVar4 = 0;
    do {
      piVar1 = (int *)((long)&local_1f8 + lVar4);
      if (*piVar1 != 0) break;
      bVar11 = lVar4 != 0x3c;
      lVar4 = lVar4 + 4;
    } while (bVar11);
    if (*piVar1 == 0) {
      local_e5 = 0x30;
      uVar6 = 0x86;
    }
    else {
      uVar5 = uintwide_t<512U,_unsigned_int,_void,_false>::extract_hex_digits<false,_nullptr>
                        ((uintwide_t<24U,_unsigned_char,_void,_false> *)&local_1f8,local_e4,
                         is_uppercase);
      uVar6 = 0x87 - uVar5;
    }
    if ((show_base) && (1 < (long)uVar6)) {
      local_16b[(int)uVar6 - 1] = !is_uppercase << 5 | 0x58;
      uVar6 = uVar6 - 2;
      local_16b[uVar6 & 0xffffffff] = 0x30;
    }
    if ((show_pos) && (0 < (long)uVar6)) {
      uVar6 = uVar6 - 1;
      local_16b[uVar6 & 0xffffffff] = 0x2b;
    }
    if (field_width != 0) {
      lVar4 = 0;
      if (field_width < 0x88) {
        lVar4 = 0x87 - field_width;
      }
      while (lVar4 < (long)uVar6) {
        uVar6 = uVar6 - 1;
        local_16b[uVar6 & 0xffffffff] = fill_char_str;
      }
    }
    local_e4[0] = '\0';
    lVar4 = 0;
    do {
      bVar2 = local_16b[lVar4 + uVar6];
      str_result[lVar4] = bVar2;
      lVar4 = lVar4 + 1;
    } while (bVar2 != 0);
  }
  else if (iVar8 == 10) {
    local_1b8 = *(undefined8 *)this;
    uStack_1b0 = *(undefined8 *)(this + 8);
    local_1a8 = *(undefined8 *)(this + 0x10);
    uStack_1a0 = *(undefined8 *)(this + 0x18);
    local_198 = *(undefined8 *)(this + 0x20);
    uStack_190 = *(undefined8 *)(this + 0x28);
    local_188 = *(undefined8 *)(this + 0x30);
    uStack_180 = *(undefined8 *)(this + 0x38);
    memset(local_16b,0,0xa3);
    lVar4 = 0;
    do {
      piVar1 = (int *)((long)&local_1b8 + lVar4);
      if (*piVar1 != 0) break;
      bVar11 = lVar4 != 0x3c;
      lVar4 = lVar4 + 4;
    } while (bVar11);
    if (*piVar1 != 0) {
      uVar6 = 0xa3;
      do {
        uStack_1c0 = uStack_180;
        lVar4 = 0;
        do {
          piVar1 = (int *)((long)&local_1b8 + lVar4);
          if (*piVar1 != 0) break;
          bVar11 = lVar4 != 0x3c;
          lVar4 = lVar4 + 4;
        } while (bVar11);
        if ((uVar6 == 0) || (*piVar1 == 0)) goto LAB_00150536;
        local_88 = local_188;
        uStack_80 = uStack_180;
        local_98 = local_198;
        uStack_90 = uStack_190;
        local_a8 = local_1a8;
        uStack_a0 = uStack_1a0;
        local_b8 = local_1b8;
        uStack_b0 = uStack_1b0;
        lVar4 = 0x3c;
        uVar9 = 0;
        uVar7 = 0;
        do {
          uVar7 = CONCAT44((int)uVar7 + (int)uVar9 * -10,*(undefined4 *)((long)&local_1b8 + lVar4));
          uVar9 = uVar7 / 10;
          *(int *)((long)&local_1b8 + lVar4) = (int)uVar9;
          lVar4 = lVar4 + -4;
        } while (lVar4 != -4);
        local_48 = local_188;
        uStack_40 = uStack_180;
        local_58 = local_198;
        uStack_50 = uStack_190;
        local_68 = local_1a8;
        uStack_60 = uStack_1a0;
        local_78 = local_1b8;
        uStack_70 = uStack_1b0;
        lVar4 = 0;
        uVar7 = 0;
        do {
          uVar7 = uVar7 + (ulong)*(uint *)((long)&local_78 + lVar4 * 4) * 10;
          *(int *)((long)&local_78 + lVar4 * 4) = (int)uVar7;
          uVar7 = uVar7 >> 0x20;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x10);
        local_1c8 = local_188;
        local_1d8 = local_198;
        uStack_1d0 = uStack_190;
        local_1e8 = local_1a8;
        uStack_1e0 = uStack_1a0;
        local_1f8 = local_1b8;
        uStack_1f0 = uStack_1b0;
        lVar4 = 0;
        bVar11 = false;
        do {
          uVar7 = ((ulong)*(uint *)((long)&local_1f8 + lVar4 * 4) - (ulong)bVar11) -
                  (ulong)*(uint *)((long)&local_78 + lVar4 * 4);
          *(int *)((long)&local_1f8 + lVar4 * 4) = (int)uVar7;
          bVar11 = uVar7 >> 0x20 != 0;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x10);
        local_16b[uVar6 - 1 & 0xffffffff] = (byte)local_1f8 + 0x30;
        uVar6 = uVar6 - 1;
      } while( true );
    }
    local_c9 = 0x30;
    uVar6 = 0xa2;
LAB_00150536:
    if (show_pos && 0 < (long)uVar6) {
      uVar6 = uVar6 - 1;
      local_16b[uVar6 & 0xffffffff] = 0x2b;
    }
    if (field_width != 0) {
      lVar4 = 0;
      if (field_width < 0xa4) {
        lVar4 = 0xa3 - field_width;
      }
      while (lVar4 < (long)uVar6) {
        uVar6 = uVar6 - 1;
        local_16b[uVar6 & 0xffffffff] = fill_char_str;
      }
    }
    local_c8 = 0;
    lVar4 = 0;
    do {
      bVar2 = local_16b[lVar4 + uVar6];
      str_result[lVar4] = bVar2;
      lVar4 = lVar4 + 1;
    } while (bVar2 != 0);
  }
  else {
    if (iVar8 != 8) {
      return false;
    }
    local_1f8 = *(undefined8 *)this;
    uStack_1f0 = *(undefined8 *)(this + 8);
    local_1e8 = *(undefined8 *)(this + 0x10);
    uStack_1e0 = *(undefined8 *)(this + 0x18);
    local_1d8 = *(undefined8 *)(this + 0x20);
    uStack_1d0 = *(undefined8 *)(this + 0x28);
    local_1c8 = *(undefined8 *)(this + 0x30);
    uStack_1c0 = *(undefined8 *)(this + 0x38);
    memset(local_16b,0,0xb2);
    lVar4 = 0;
    do {
      piVar1 = (int *)((long)&local_1f8 + lVar4);
      if (*piVar1 != 0) break;
      bVar11 = lVar4 != 0x3c;
      lVar4 = lVar4 + 4;
    } while (bVar11);
    if (*piVar1 != 0) {
      uVar6 = 0xb2;
      do {
        lVar4 = 0;
        do {
          piVar1 = (int *)((long)&local_1f8 + lVar4);
          if (*piVar1 != 0) break;
          bVar11 = lVar4 != 0x3c;
          lVar4 = lVar4 + 4;
        } while (bVar11);
        uVar7 = uVar6 - 1;
        if ((uVar6 == 0) || (*piVar1 == 0)) goto LAB_00150656;
        local_16b[uVar7 & 0xffffffff] = (byte)local_1f8 & 7 | 0x30;
        uVar10 = 0;
        lVar4 = 0x3c;
        do {
          uVar3 = *(uint *)((long)&local_1f8 + lVar4);
          *(uint *)((long)&local_1f8 + lVar4) = uVar3 >> 3 | uVar10;
          uVar10 = uVar3 << 0x1d;
          lVar4 = lVar4 + -4;
          uVar6 = uVar7;
        } while (lVar4 != -4);
      } while( true );
    }
    local_ba = 0x30;
    uVar6 = 0xb1;
LAB_00150656:
    if (show_base && 0 < (long)uVar6) {
      uVar6 = uVar6 - 1;
      local_16b[uVar6 & 0xffffffff] = 0x30;
    }
    if (show_pos && 0 < (long)uVar6) {
      uVar6 = uVar6 - 1;
      local_16b[uVar6 & 0xffffffff] = 0x2b;
    }
    if (field_width != 0) {
      lVar4 = 0;
      if (field_width < 0xb3) {
        lVar4 = 0xb2 - field_width;
      }
      while (lVar4 < (long)uVar6) {
        uVar6 = uVar6 - 1;
        local_16b[uVar6 & 0xffffffff] = fill_char_str;
      }
    }
    local_b9 = 0;
    lVar4 = 0;
    do {
      bVar2 = local_16b[lVar4 + uVar6];
      str_result[lVar4] = bVar2;
      lVar4 = lVar4 + 1;
    } while (bVar2 != 0);
  }
  return true;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }